

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

void __thiscall CVmUndo::gc_remove_stale_weak_refs(CVmUndo *this)

{
  int iVar1;
  CVmObjTable *in_RDI;
  CVmUndoMeta *next_link;
  CVmUndoMeta *cur;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  CVmObjGlobPage *pCVar2;
  CVmObjGlobPage *this_00;
  
  if (in_RDI->pages_ != (CVmObjPageEntry **)0x0) {
    pCVar2 = (CVmObjGlobPage *)in_RDI->pages_;
    this_00 = (CVmObjGlobPage *)in_RDI->pages_;
    do {
      if (this_00 == pCVar2) {
        pCVar2 = (CVmObjGlobPage *)this_00->used_;
      }
      else if (*(int *)&this_00->nxt_ != 0) {
        iVar1 = CVmObjTable::is_obj_deletable(in_RDI,in_stack_ffffffffffffffdc);
        if (iVar1 == 0) {
          CVmObjTable::remove_obj_stale_undo_weak_ref
                    ((CVmObjTable *)this_00,(vm_obj_id_t)((ulong)pCVar2 >> 0x20),
                     (CVmUndoRecord *)in_RDI);
        }
        else {
          *(undefined4 *)&((CVmObjTable *)this_00)->post_load_init_table_ = 0;
        }
      }
      this_00 = (CVmObjGlobPage *)&((CVmObjTable *)this_00)->page_slots_;
      if (this_00 == (CVmObjGlobPage *)(in_RDI->pages_used_ + *(long *)&in_RDI->first_free_ * 0x20))
      {
        this_00 = (CVmObjGlobPage *)in_RDI->pages_used_;
      }
    } while (this_00 != (CVmObjGlobPage *)in_RDI->page_slots_);
  }
  return;
}

Assistant:

void CVmUndo::gc_remove_stale_weak_refs(VMG0_)
{
    CVmUndoMeta *cur;
    CVmUndoMeta *next_link;

    /* if we don't have any records, there's nothing to do */
    if (oldest_first_ == 0)
        return;

    /* the first record is a linking record */
    next_link = oldest_first_;

    /* start at the first record */
    cur = oldest_first_;

    /* 
     *   Go through all undo records, from the oldest to the newest.  Note
     *   that we must keep track of each "link" record, because these are
     *   not ordinary undo records and must be handled differently.  
     */
    for (;;)
    {
        /* check to see if this is a linking record or an ordinary record */
        if (cur == next_link)
        {
            /* 
             *   this is a linking record - simply note the next linking
             *   record and otherwise ignore this record 
             */
            next_link = cur->link.next_first;
        }
        else if (cur->rec.obj != VM_INVALID_OBJ)
        {
            /* 
             *   It's an ordinary undo record -- delete its stale
             *   references.  If the record owner is itself about to be
             *   deleted, don't bother with the object, but rather delete
             *   the entire undo record -- undo records themselves only
             *   weakly reference their owning objects.  
             */
            if (!G_obj_table->is_obj_deletable(cur->rec.obj))
            {
                /* it's not ready for deletion - clean up its weak refs */
                G_obj_table->remove_obj_stale_undo_weak_ref(
                    vmg_ cur->rec.obj, &cur->rec);
            }
            else
            {
                /* 
                 *   it's no longer reachable - delete the undo record by
                 *   setting the owning object to 'invalid' 
                 */
                cur->rec.obj = VM_INVALID_OBJ;
            }
        }

        /* advance to the next record, wrapping at the end of the array */
        ++cur;
        if (cur == rec_arr_ + rec_arr_size_)
            cur = rec_arr_;

        /* stop if we've reached the last record */
        if (cur == next_free_)
            break;
    }
}